

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

void Bac_ManMoveNames(Bac_Man_t *pNew,Bac_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  Bac_Ntk_t *p_01;
  Bac_Ntk_t *p_02;
  int local_4c;
  
  lVar4 = 1;
  do {
    if (p->nNtks < lVar4) {
      return;
    }
    iVar5 = p->pNtks[lVar4].iCopy;
    if (((long)iVar5 < 1) || (pNew->nNtks < iVar5)) {
      p_01 = (Bac_Ntk_t *)0x0;
    }
    else {
      p_01 = pNew->pNtks + iVar5;
    }
    p_02 = p->pNtks + lVar4;
    if ((p_02->vName).pArray == (int *)0x0) {
      __assert_fail("Bac_NtkHasNames(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x255,"void Bac_NtkMoveNames(Bac_Ntk_t *, Bac_Ntk_t *)");
    }
    if ((p_01->vName).pArray != (int *)0x0) {
      __assert_fail("!Bac_NtkHasNames(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x256,"void Bac_NtkMoveNames(Bac_Ntk_t *, Bac_Ntk_t *)");
    }
    iVar5 = (p_01->vType).nCap;
    if (iVar5 == 0) {
      __assert_fail("Bac_NtkObjNumAlloc(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
    }
    Vec_IntFill(&p_01->vName,iVar5,0);
    p_00 = &p_02->vCopy;
    for (iVar5 = 0; iVar5 < (p_02->vInputs).nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(&p_02->vInputs,iVar5);
      iVar2 = Vec_IntEntry(p_00,iVar1);
      iVar1 = Bac_ObjName(p_02,iVar1);
      Bac_ObjSetName(p_01,iVar2,iVar1);
    }
    local_4c = 1;
    for (iVar5 = 0; iVar1 = (p_02->vType).nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
      iVar2 = Bac_ObjIsBoxUser(p_02,iVar5);
      iVar1 = local_4c;
      while (iVar2 != 0) {
        iVar2 = Vec_IntEntry(p_00,iVar1 + -1);
        iVar3 = Bac_ObjName(p_02,iVar1 + -1);
        Bac_ObjSetName(p_01,iVar2,iVar3);
        if ((p_02->vType).nSize <= iVar1) break;
        iVar2 = Bac_ObjIsBo(p_02,iVar1);
        iVar1 = iVar1 + 1;
      }
      local_4c = local_4c + 1;
    }
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      iVar2 = Bac_ObjIsBoxUser(p_02,iVar5);
      iVar1 = iVar5;
      if (iVar2 != 0) {
        while (0 < iVar1) {
          iVar1 = iVar1 + -1;
          iVar2 = Bac_ObjIsBi(p_02,iVar1);
          if (iVar2 == 0) break;
          iVar2 = Vec_IntEntry(p_00,iVar1);
          iVar2 = Bac_ObjFanin(p_01,iVar2);
          iVar2 = Bac_ObjName(p_01,iVar2);
          if (iVar2 == 0) {
            iVar2 = Vec_IntEntry(p_00,iVar1);
            iVar2 = Bac_ObjFanin(p_01,iVar2);
            iVar3 = Bac_ObjName(p_02,iVar1);
            Bac_ObjSetName(p_01,iVar2,iVar3);
          }
        }
      }
      iVar1 = (p_02->vType).nSize;
    }
    for (iVar5 = 0; iVar5 < (p_02->vOutputs).nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(&p_02->vOutputs,iVar5);
      iVar2 = Vec_IntEntry(p_00,iVar1);
      iVar2 = Bac_ObjFanin(p_01,iVar2);
      iVar2 = Bac_ObjName(p_01,iVar2);
      if (iVar2 == 0) {
        iVar2 = Vec_IntEntry(p_00,iVar1);
        iVar2 = Bac_ObjFanin(p_01,iVar2);
        iVar1 = Bac_ObjName(p_02,iVar1);
        Bac_ObjSetName(p_01,iVar2,iVar1);
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static inline void Bac_ManMoveNames( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkMoveNames( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
}